

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

vm_obj_id_t CVmObjDate::create(int in_root_set,int32_t dayno,int32_t daytime)

{
  vm_obj_id_t vVar1;
  int in_EDX;
  uint32_t in_ESI;
  int32_t in_EDI;
  CVmObjDate *unaff_retaddr;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  vVar1 = vm_new_id(in_EDX,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(in_EDX,vVar1),in_stack_ffffffffffffffec);
  CVmObjDate(unaff_retaddr,in_EDI,in_ESI);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjDate::create(VMG_ int in_root_set,
                               int32_t dayno, int32_t daytime)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);
    return id;
}